

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:1089:34)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:1089:34)>
             *this)

{
  Quantity<long,_kj::_::NanosecondLabel> this_00;
  atomic<unsigned_int> *paVar1;
  undefined8 node;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_240 [184];
  UnixEventPort local_188;
  Promise<siginfo_t> local_90 [16];
  
  UnixEventPort::UnixEventPort(&local_188);
  this_00.value = (long)local_240 + 0x40;
  EventLoop::EventLoop((EventLoop *)this_00.value,&local_188.super_EventPort);
  local_240._40_4_ = 0xffffffff;
  local_240._48_8_ = (Impl *)0x0;
  local_240._56_8_ = (SleepHooks *)0x0;
  local_240._32_8_ = this_00.value;
  EventLoop::enterScope((EventLoop *)this_00.value);
  paVar1 = (this->f).readyCount;
  LOCK();
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  UnixEventPort::onSignal((UnixEventPort *)local_240,(int)&local_188);
  local_240._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_240._16_8_ = "operator()";
  local_240._24_8_ = (_func_int **)0x700000447;
  Promise<siginfo_t>::wait(local_90,local_240);
  node = local_240._0_8_;
  if ((PromiseArenaMember *)local_240._0_8_ != (PromiseArenaMember *)0x0) {
    local_240._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  paVar1 = (this->f).doneCount;
  LOCK();
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if ((Impl *)local_240._48_8_ == (Impl *)0x0) {
    EventLoop::leaveScope((EventLoop *)local_240._32_8_);
  }
  EventLoop::~EventLoop((EventLoop *)(local_240 + 0x40));
  UnixEventPort::~UnixEventPort(&local_188);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }